

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_callback.hpp
# Opt level: O2

void __thiscall
asio::ssl::detail::verify_callback<asio::ssl::rfc2818_verification>::~verify_callback
          (verify_callback<asio::ssl::rfc2818_verification> *this)

{
  ~verify_callback(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit verify_callback(VerifyCallback callback)
    : callback_(callback)
  {
  }